

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TestRequestNeededHelper::RunImpl
          (initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *this)

{
  int64_t *this_00;
  Message *pMVar1;
  TestResults *pTVar2;
  bool bVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_678 [2];
  TestDetails local_638;
  int local_618 [2];
  UtcTimeStamp local_610;
  Logon local_5f8;
  undefined1 local_4a0 [8];
  Message receivedLogon;
  Logon local_338;
  Message local_1e0 [8];
  Message sentLogon;
  undefined1 local_88 [8];
  UtcTimeStamp time;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *local_10;
  initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  this_00 = &time.super_DateTime.m_time;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)this_00,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,
             (UtcTimeOnly *)this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)this_00);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_88);
  createLogon(&local_338,"TW","ISLD",1);
  FIX::Message::Message(local_1e0,(Message *)&local_338);
  FIX42::Logon::~Logon(&local_338);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_5f8,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_4a0,(Message *)&local_5f8);
  FIX42::Logon::~Logon(&local_5f8);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_610);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_4a0,SUB81(&local_610,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_610);
  FIX::process_sleep(2.0);
  FIX::Session::next();
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar4;
  local_618[1] = 4;
  local_618[0] = FIX::Session::getExpectedSenderNum
                           ((this->super_initiatorFixture).super_sessionFixture.object);
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_638,*ppTVar5,0x78e);
  UnitTest::CheckEqual<int,int>(pTVar2,local_618 + 1,local_618,&local_638);
  bVar3 = FIX::Session::isLoggedOn((this->super_initiatorFixture).super_sessionFixture.object);
  bVar3 = UnitTest::Check<bool>(bVar3);
  if (!bVar3) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_678,*ppTVar5,0x78f);
    UnitTest::TestResults::OnTestFailure(pTVar2,local_678,"object->isLoggedOn()");
  }
  FIX::Message::~Message((Message *)local_4a0);
  FIX::Message::~Message(local_1e0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_88);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TestRequestNeeded) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Interval Flow
  process_sleep(2);

  object->next();
  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK(object->isLoggedOn());
}